

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_8,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Type in0;
  Vector<float,_3> local_90;
  Type in1;
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_2,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,8>(&in0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_2,_3>::Matrix(&in0,(float *)s_constInMat3x2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,12>(&in1,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_4>::Matrix(&in1,(float *)(s_constInMat4x3 + 0x30));
  }
  tcu::operator*(&local_38,&in0,&in1);
  local_90.m_data[2] = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  local_90.m_data[0] =
       local_38.m_data.m_data[3].m_data[0] +
       local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1];
  local_90.m_data[1] =
       local_38.m_data.m_data[3].m_data[1] +
       local_38.m_data.m_data[1].m_data[1] + local_38.m_data.m_data[1].m_data[0];
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,&local_90);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}